

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::SequenceMethodExprVisitor::visit<slang::ast::ClockingEventExpression>
          (SequenceMethodExprVisitor *this,ClockingEventExpression *expr)

{
  Symbol *pSVar1;
  Diagnostic *this_00;
  
  if ((expr->super_Expression).kind == NamedValue) {
    pSVar1 = Expression::getSymbolReference(&expr->super_Expression,true);
    if ((pSVar1 != (Symbol *)0x0) &&
       ((pSVar1->kind == LocalAssertionVar ||
        ((pSVar1->kind == AssertionPort && (*(char *)((long)&pSVar1[2].name._M_len + 4) == '\x01')))
        ))) {
      this_00 = ASTContext::addDiag(this->context,(DiagCode)0x23000b,
                                    (expr->super_Expression).sourceRange);
      Diagnostic::operator<<(this_00,&this->name);
    }
  }
  TimingControl::visit<slang::ast::builtins::SequenceMethodExprVisitor>(expr->timingControl,this);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.kind == ExpressionKind::NamedValue) {
                if (auto sym = expr.getSymbolReference()) {
                    if (sym->kind == SymbolKind::LocalAssertionVar ||
                        (sym->kind == SymbolKind::AssertionPort &&
                         sym->template as<AssertionPortSymbol>().isLocalVar())) {
                        context.addDiag(diag::SequenceMethodLocalVar, expr.sourceRange) << name;
                    }
                }
            }
        }

        if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, SequenceMethodExprVisitor>)
            expr.visitExprs(*this);
    }